

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_time.h
# Opt level: O1

uint64_t stm_now(void)

{
  timespec ts;
  timespec local_18;
  
  if (_stm.initialized == 0xabcdabcd) {
    clock_gettime(1,&local_18);
    return (local_18.tv_sec * 1000000000 + local_18.tv_nsec) - _stm.start;
  }
  __assert_fail("_stm.initialized == 0xABCDABCD",
                "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/sokol/sokol_time.h"
                ,0xe2,"uint64_t stm_now(void)");
}

Assistant:

SOKOL_API_IMPL uint64_t stm_now(void) {
    SOKOL_ASSERT(_stm.initialized == 0xABCDABCD);
    uint64_t now;
    #if defined(_WIN32)
        LARGE_INTEGER qpc_t;
        QueryPerformanceCounter(&qpc_t);
        now = int64_muldiv(qpc_t.QuadPart - _stm.start.QuadPart, 1000000000, _stm.freq.QuadPart);
    #elif defined(__APPLE__) && defined(__MACH__)
        const uint64_t mach_now = mach_absolute_time() - _stm.start;
        now = int64_muldiv(mach_now, _stm.timebase.numer, _stm.timebase.denom);
    #elif defined(__EMSCRIPTEN__)
        double js_now = stm_js_perfnow() - _stm.start;
        SOKOL_ASSERT(js_now >= 0.0);
        now = (uint64_t) (js_now * 1000000.0);
    #else
        struct timespec ts;
        clock_gettime(CLOCK_MONOTONIC, &ts);
        now = ((uint64_t)ts.tv_sec*1000000000 + (uint64_t)ts.tv_nsec) - _stm.start;
    #endif
    return now;
}